

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prlefreader.cpp
# Opt level: O0

void __thiscall PRLEFReader::doIntegrityChecks(PRLEFReader *this)

{
  double dVar1;
  ulong uVar2;
  undefined8 uVar3;
  PRLEFReader *this_local;
  
  if (this->m_parseCell == (LEFCellInfo_t *)0x0) {
    doLog(8,"PRLEFReader: cannot do integrity checks on a NULL cell\n");
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      std::__cxx11::string::operator=
                ((string *)&this->m_parseCell->m_foreign,(string *)this->m_parseCell);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      dVar1 = this->m_parseCell->m_sx;
      if (((dVar1 == 0.0) && (!NAN(dVar1))) ||
         ((dVar1 = this->m_parseCell->m_sy, dVar1 == 0.0 && (!NAN(dVar1))))) {
        uVar3 = std::__cxx11::string::c_str();
        doLog(8,"PRLEFReader: cell %s has zero width or height\n",uVar3);
      }
    }
    else {
      doLog(8,"PRLEFReader: current cell has no name!\n");
    }
  }
  return;
}

Assistant:

void PRLEFReader::doIntegrityChecks()
{
    // perform integrity checks on the current cell
    if (m_parseCell == nullptr)
    {
        doLog(LOG_ERROR, "PRLEFReader: cannot do integrity checks on a NULL cell\n");
        return;
    }

    if (m_parseCell->m_foreign.empty())
    {
        m_parseCell->m_foreign = m_parseCell->m_name;
    }

    if (m_parseCell->m_name.empty())
    {
        doLog(LOG_ERROR, "PRLEFReader: current cell has no name!\n");
        return;
    }

    if ((m_parseCell->m_sx == 0.0) || (m_parseCell->m_sy == 0.0))
    {
        doLog(LOG_ERROR,"PRLEFReader: cell %s has zero width or height\n",
            m_parseCell->m_name.c_str());
    }
}